

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::branch
          (CompilerGLSL *this,BlockID from,uint32_t cond,BlockID true_block,BlockID false_block)

{
  bool bVar1;
  bool bVar2;
  SPIRBlock *pSVar3;
  uint32_t uVar4;
  string local_50;
  
  pSVar3 = Compiler::get<spirv_cross::SPIRBlock>(&this->super_Compiler,from.id);
  uVar4 = 0;
  if (pSVar3->merge == MergeSelection) {
    uVar4 = (pSVar3->next_block).id;
  }
  bVar2 = true;
  bVar1 = true;
  if (uVar4 == true_block.id) {
    bVar1 = Compiler::flush_phi_required(&this->super_Compiler,from,true_block);
  }
  if ((uVar4 == false_block.id) &&
     (bVar2 = Compiler::flush_phi_required(&this->super_Compiler,from,false_block),
     (bVar2 | bVar1) != 1)) {
    return;
  }
  if (pSVar3->hint - HintFlatten < 2) {
    (*(this->super_Compiler)._vptr_Compiler[0x38])(this,pSVar3);
  }
  if (bVar1 == false) {
    if (bVar2 == false) {
      return;
    }
    to_enclosed_expression_abi_cxx11_(&local_50,this,cond,true);
    statement<char_const(&)[6],std::__cxx11::string,char_const(&)[2]>
              (this,(char (*) [6])"if (!",&local_50,(char (*) [2])0x3a9fc7);
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    to_expression_abi_cxx11_(&local_50,this,cond,true);
    statement<char_const(&)[5],std::__cxx11::string,char_const(&)[2]>
              (this,(char (*) [5])"if (",&local_50,(char (*) [2])0x3a9fc7);
    ::std::__cxx11::string::~string((string *)&local_50);
    begin_scope(this);
    branch(this,from,true_block);
    end_scope(this);
    if (bVar2 == false) {
      return;
    }
    statement<char_const(&)[5]>(this,(char (*) [5])0x3a12f7);
  }
  begin_scope(this);
  branch(this,from,false_block);
  end_scope(this);
  return;
}

Assistant:

void CompilerGLSL::branch(BlockID from, uint32_t cond, BlockID true_block, BlockID false_block)
{
	auto &from_block = get<SPIRBlock>(from);
	BlockID merge_block = from_block.merge == SPIRBlock::MergeSelection ? from_block.next_block : BlockID(0);

	// If we branch directly to our selection merge target, we don't need a code path.
	bool true_block_needs_code = true_block != merge_block || flush_phi_required(from, true_block);
	bool false_block_needs_code = false_block != merge_block || flush_phi_required(from, false_block);

	if (!true_block_needs_code && !false_block_needs_code)
		return;

	// We might have a loop merge here. Only consider selection flattening constructs.
	// Loop hints are handled explicitly elsewhere.
	if (from_block.hint == SPIRBlock::HintFlatten || from_block.hint == SPIRBlock::HintDontFlatten)
		emit_block_hints(from_block);

	if (true_block_needs_code)
	{
		statement("if (", to_expression(cond), ")");
		begin_scope();
		branch(from, true_block);
		end_scope();

		if (false_block_needs_code)
		{
			statement("else");
			begin_scope();
			branch(from, false_block);
			end_scope();
		}
	}
	else if (false_block_needs_code)
	{
		// Only need false path, use negative conditional.
		statement("if (!", to_enclosed_expression(cond), ")");
		begin_scope();
		branch(from, false_block);
		end_scope();
	}
}